

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O2

void __thiscall DyndepParserTestNoImplicit::Run(DyndepParserTestNoImplicit *this)

{
  int iVar1;
  bool bVar2;
  iterator iVar3;
  
  iVar1 = g_current_test->assertion_failures_;
  DyndepParserTest::AssertParse
            (&this->super_DyndepParserTest,"ninja_dyndep_version = 1\nbuild out: dyndep\n");
  if (iVar1 == g_current_test->assertion_failures_) {
    testing::Test::Check
              (g_current_test,
               (this->super_DyndepParserTest).dyndep_file_.
               super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_node_count == 1,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
               ,0x16a,"1u == dyndep_file_.size()");
    iVar3 = std::
            _Rb_tree<Edge_*,_std::pair<Edge_*const,_Dyndeps>,_std::_Select1st<std::pair<Edge_*const,_Dyndeps>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
            ::find((_Rb_tree<Edge_*,_std::pair<Edge_*const,_Dyndeps>,_std::_Select1st<std::pair<Edge_*const,_Dyndeps>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                    *)&(this->super_DyndepParserTest).dyndep_file_,
                   (this->super_DyndepParserTest).state_.edges_.
                   super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                   super__Vector_impl_data._M_start);
    bVar2 = testing::Test::Check
                      (g_current_test,
                       (_Rb_tree_header *)iVar3._M_node !=
                       &(this->super_DyndepParserTest).dyndep_file_.
                        super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                        ._M_t._M_impl.super__Rb_tree_header,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                       ,0x16c,"i != dyndep_file_.end()");
    if (bVar2) {
      testing::Test::Check
                (g_current_test,*(char *)((long)&iVar3._M_node[1]._M_parent + 1) == '\0',
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                 ,0x16d,"false == i->second.restat_");
      testing::Test::Check
                (g_current_test,iVar3._M_node[2]._M_left == iVar3._M_node[2]._M_parent,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                 ,0x16e,"0u == i->second.implicit_outputs_.size()");
      testing::Test::Check
                (g_current_test,iVar3._M_node[1]._M_right == iVar3._M_node[1]._M_left,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                 ,0x16f,"0u == i->second.implicit_inputs_.size()");
      return;
    }
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(DyndepParserTest, NoImplicit) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"ninja_dyndep_version = 1\n"
"build out: dyndep\n"));

  EXPECT_EQ(1u, dyndep_file_.size());
  DyndepFile::iterator i = dyndep_file_.find(state_.edges_[0]);
  ASSERT_NE(i, dyndep_file_.end());
  EXPECT_EQ(false, i->second.restat_);
  EXPECT_EQ(0u, i->second.implicit_outputs_.size());
  EXPECT_EQ(0u, i->second.implicit_inputs_.size());
}